

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void kj::ArrayDisposer::Dispose_<kj::Own<capnp::_::SegmentBuilder>,_false>::destruct(void *ptr)

{
  if (*(long *)((long)ptr + 8) != 0) {
    *(undefined8 *)((long)ptr + 8) = 0;
    (**(code **)**ptr)();
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }